

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void update_ext_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize,
               PARTITION_TYPE partition)

{
  BLOCK_SIZE subsize_00;
  uint mi_col_00;
  undefined1 in_CL;
  byte bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_R8D;
  undefined1 in_R9B;
  BLOCK_SIZE bsize2;
  int hbs;
  BLOCK_SIZE in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffec;
  int mi_row_00;
  
  bVar1 = (byte)in_R8D;
  mi_row_00 = CONCAT22(CONCAT11(in_CL,bVar1),CONCAT11(in_R9B,in_stack_ffffffffffffffec));
  if (2 < bVar1) {
    mi_col_00 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [bVar1] >> 1);
    subsize_00 = get_partition_subsize
                           ((BLOCK_SIZE)((uint)in_R8D >> 0x10),(PARTITION_TYPE)((uint)in_R8D >> 8));
    switch((char)((uint)mi_row_00 >> 8)) {
    case '\x03':
      if ((char)((uint)mi_row_00 >> 0x10) != '\x03') {
        return;
      }
    case '\0':
    case '\x01':
    case '\x02':
    case '\b':
    case '\t':
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      break;
    case '\x04':
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      break;
    case '\x05':
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      break;
    case '\x06':
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      break;
    case '\a':
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
      update_partition_context
                ((MACROBLOCKD *)CONCAT44(in_ESI,in_EDX),mi_row_00,mi_col_00,subsize_00,
                 in_stack_ffffffffffffffe6);
    }
  }
  return;
}

Assistant:

static inline void update_ext_partition_context(MACROBLOCKD *xd, int mi_row,
                                                int mi_col, BLOCK_SIZE subsize,
                                                BLOCK_SIZE bsize,
                                                PARTITION_TYPE partition) {
  if (bsize >= BLOCK_8X8) {
    const int hbs = mi_size_wide[bsize] / 2;
    BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
    switch (partition) {
      case PARTITION_SPLIT:
        if (bsize != BLOCK_8X8) break;
        AOM_FALLTHROUGH_INTENDED;
      case PARTITION_NONE:
      case PARTITION_HORZ:
      case PARTITION_VERT:
      case PARTITION_HORZ_4:
      case PARTITION_VERT_4:
        update_partition_context(xd, mi_row, mi_col, subsize, bsize);
        break;
      case PARTITION_HORZ_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, subsize, subsize);
        break;
      case PARTITION_HORZ_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, bsize2, subsize);
        break;
      case PARTITION_VERT_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, subsize, subsize);
        break;
      case PARTITION_VERT_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, bsize2, subsize);
        break;
      default: assert(0 && "Invalid partition type");
    }
  }
}